

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O0

void Diligent::anon_unknown_347::ApplyImageBindings
               (GLuint glProg,char *ImgName,Uint32 BaseBinding,Uint32 ArraySize)

{
  undefined *puVar1;
  int iVar2;
  Char *Message;
  undefined8 uVar3;
  char (*in_R8) [74];
  char (*in_stack_ffffffffffffff38) [259];
  char (*in_stack_ffffffffffffff48) [259];
  undefined1 local_a0 [8];
  string _msg_1;
  string _msg;
  uint local_58;
  Uint32 ImgBinding;
  Uint32 ArrInd;
  undefined1 local_48 [8];
  string msg;
  GLint UniformLocation;
  Uint32 ArraySize_local;
  Uint32 BaseBinding_local;
  char *ImgName_local;
  GLuint glProg_local;
  
  _ArraySize_local = ImgName;
  ImgName_local._4_4_ = glProg;
  msg.field_2._12_4_ = (*__glewGetUniformLocation)(glProg,ImgName);
  if ((int)msg.field_2._12_4_ < 0) {
    FormatString<char[23],char_const*,char[74]>
              ((string *)local_48,(Diligent *)"Failed to find image \'",
               (char (*) [23])&ArraySize_local,
               (char **)"\', which is unexpected as it is present in the list of program resources."
               ,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"ApplyImageBindings",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0xf4);
    std::__cxx11::string::~string((string *)local_48);
  }
  for (local_58 = 0; local_58 < ArraySize; local_58 = local_58 + 1) {
    _msg.field_2._12_4_ = BaseBinding + local_58;
    (*__glewUniform1i)(msg.field_2._12_4_ + local_58,_msg.field_2._12_4_);
    iVar2 = glGetError();
    if (iVar2 != 0) {
      if (ArraySize < 2) {
        FormatString<char[42],char_const*,char[22],unsigned_int,char[259]>
                  ((string *)local_a0,(Diligent *)"Failed to set binding for image uniform \'",
                   (char (*) [42])&ArraySize_local,(char **)"\'. Expected binding: ",
                   (char (*) [22])((long)&_msg.field_2 + 0xc),
                   (uint *)
                   ". Make sure that this binding is explicitly assigned in shader source code. Note that if the source code is converted from HLSL and if images are only used by a single shader stage, then bindings automatically assigned by HLSL->GLSL converter will work fine."
                   ,in_stack_ffffffffffffff38);
        if (DebugMessageCallback != (undefined *)0x0) {
          in_stack_ffffffffffffff48 = (char (*) [259])DebugMessageCallback;
          uVar3 = std::__cxx11::string::c_str();
          (*(code *)in_stack_ffffffffffffff48)(1,uVar3,0);
        }
        std::__cxx11::string::~string((string *)local_a0);
      }
      else {
        in_stack_ffffffffffffff38 = (char (*) [259])((long)&_msg.field_2 + 0xc);
        FormatString<char[42],char_const*,char[3],unsigned_int,char[22],unsigned_int,char[259]>
                  ((string *)((long)&_msg_1.field_2 + 8),
                   (Diligent *)"Failed to set binding for image uniform \'",
                   (char (*) [42])&ArraySize_local,(char **)"\'[",(char (*) [3])&local_58,
                   (uint *)"]. Expected binding: ",(char (*) [22])in_stack_ffffffffffffff38,
                   (uint *)
                   ". Make sure that this binding is explicitly assigned in shader source code. Note that if the source code is converted from HLSL and if images are only used by a single shader stage, then bindings automatically assigned by HLSL->GLSL converter will work fine."
                   ,in_stack_ffffffffffffff48);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar3 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(1,uVar3,0);
        }
        std::__cxx11::string::~string((string *)(_msg_1.field_2._M_local_buf + 8));
      }
    }
  }
  return;
}

Assistant:

inline void ApplyImageBindings(GLuint glProg, const char* ImgName, Uint32 BaseBinding, Uint32 ArraySize)
{
    const auto UniformLocation = glGetUniformLocation(glProg, ImgName);
    VERIFY(UniformLocation >= 0, "Failed to find image '", ImgName,
           "', which is unexpected as it is present in the list of program resources.");

    for (Uint32 ArrInd = 0; ArrInd < ArraySize; ++ArrInd)
    {
        // glUniform1i for image uniforms is not supported in at least GLES3.2.
        // glProgramUniform1i is not available in GLES3.0
        const Uint32 ImgBinding = BaseBinding + ArrInd;
        glUniform1i(UniformLocation + ArrInd, ImgBinding);
#    ifdef DILIGENT_DEVELOPMENT
        if (glGetError() != GL_NO_ERROR)
        {
            if (ArraySize > 1)
            {
                LOG_WARNING_MESSAGE("Failed to set binding for image uniform '", ImgName, "'[", ArrInd,
                                    "]. Expected binding: ", ImgBinding,
                                    ". Make sure that this binding is explicitly assigned in shader source code."
                                    " Note that if the source code is converted from HLSL and if images are only used"
                                    " by a single shader stage, then bindings automatically assigned by HLSL->GLSL"
                                    " converter will work fine.");
            }
            else
            {
                LOG_WARNING_MESSAGE("Failed to set binding for image uniform '", ImgName,
                                    "'. Expected binding: ", ImgBinding,
                                    ". Make sure that this binding is explicitly assigned in shader source code."
                                    " Note that if the source code is converted from HLSL and if images are only used"
                                    " by a single shader stage, then bindings automatically assigned by HLSL->GLSL"
                                    " converter will work fine.");
            }
        }
#    endif
    }
}